

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O2

void composition_solid_destination_out
               (uint32_t *dest,int length,uint32_t color,uint32_t const_alpha)

{
  uint32_t uVar1;
  ulong uVar2;
  uint32_t uVar3;
  ulong uVar4;
  
  uVar3 = ~color >> 0x18;
  if (const_alpha != 0xff) {
    uVar3 = BYTE_MUL(uVar3,const_alpha);
    uVar3 = (uVar3 - const_alpha) + 0xff;
  }
  uVar4 = 0;
  uVar2 = (ulong)(uint)length;
  if (length < 1) {
    uVar2 = uVar4;
  }
  for (; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    uVar1 = BYTE_MUL(dest[uVar4],uVar3);
    dest[uVar4] = uVar1;
  }
  return;
}

Assistant:

static void composition_solid_destination_out(uint32_t* dest, int length, uint32_t color, uint32_t const_alpha)
{
    uint32_t a = plutovg_alpha(~color);
    if(const_alpha != 255)
        a = BYTE_MUL(a, const_alpha) + 255 - const_alpha;
    for(int i = 0; i < length; i++) {
        dest[i] = BYTE_MUL(dest[i], a);
    }
}